

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

Result __thiscall
tonk::gateway::SSDPRequester::OnUDPDatagram(SSDPRequester *this,char *data,uint bytes)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  StateMachine *pSVar4;
  long lVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  Result *success;
  undefined8 uVar9;
  Result result;
  string url;
  string line;
  ParsedURL parsed;
  membuf sbuf;
  istream is;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_3_a3f0114d_for___in6_u local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined4 uStack_1b0;
  undefined4 local_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined8 uStack_19c;
  undefined8 uStack_194;
  undefined **local_188;
  long local_180;
  long lStack_178;
  long lStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  locale local_150 [8];
  long local_148 [2];
  ios_base local_138 [264];
  
  lVar5 = CONCAT44(in_register_00000014,bytes);
  local_280._8_8_ = __assert_fail;
  local_188 = (undefined **)__assert_fail;
  local_180 = 0;
  lStack_178 = 0;
  lStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  std::locale::locale(local_150);
  local_188 = &PTR__streambuf_001bc898;
  local_180 = lVar5;
  lStack_178 = lVar5;
  lStack_170 = (ulong)in_ECX + lVar5;
  std::istream::istream((istream *)local_148,(streambuf *)&local_188);
  local_250._M_allocated_capacity = (size_type)local_240;
  local_250._8_8_ = 0;
  local_240[0] = 0;
  cVar1 = std::ios::widen((char)(istream *)local_148 + (char)*(undefined8 *)(local_148[0] + -0x18));
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_148,(string *)local_250._M_local_buf,cVar1);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    lVar5 = std::__cxx11::string::find(local_250._M_local_buf,0x19b6d7,0);
    if (lVar5 == -1) {
      local_230._M_allocated_capacity = (size_type)&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Ignoring malformed UDP response (No \"200 OK\")","");
      pSVar4 = (StateMachine *)operator_new(0x38);
      pSVar4->Host = (AsioHost *)0x0;
      pSVar4->SSDP = (SSDPRequester *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar4->SSDP,local_230._M_allocated_capacity,
                 (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
      goto LAB_0013b58a;
    }
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_148[0] + -0x18) +
                              (char)(istream *)local_148);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_148,(string *)local_250._M_local_buf,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        local_230._M_allocated_capacity = (size_type)&local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"No location found","")
        ;
        pSVar4 = (StateMachine *)operator_new(0x38);
        pSVar4->Host = (AsioHost *)0x0;
        pSVar4->SSDP = (SSDPRequester *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pSVar4->SSDP,local_230._M_allocated_capacity,
                   (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
        goto LAB_0013b8eb;
      }
      std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_250);
      uVar8 = local_230._M_allocated_capacity;
      iVar2 = strcasecmp((char *)local_230._M_allocated_capacity,"location:");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar8 != &local_220) {
        operator_delete((void *)uVar8);
      }
    } while (iVar2 != 0);
    lVar5 = std::__cxx11::string::find(local_250._M_local_buf,0x19b716,0);
    if (lVar5 == -1) {
      local_230._M_allocated_capacity = (size_type)&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Ignoring malformed UDP response (No protocol)","");
      pSVar4 = (StateMachine *)operator_new(0x38);
      pSVar4->Host = (AsioHost *)0x0;
      pSVar4->SSDP = (SSDPRequester *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar4->SSDP,local_230._M_allocated_capacity,
                 (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
LAB_0013b8eb:
      *(undefined4 *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
      (pSVar4->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x2;
      this->State = pSVar4;
      paVar7 = &local_220;
      local_270._M_allocated_capacity = local_230._M_allocated_capacity;
    }
    else {
      std::__cxx11::string::string
                ((string *)(local_280 + 0x10),(string *)local_250._M_local_buf,lVar5 + 3,
                 (allocator *)local_230._M_local_buf);
      uVar8 = local_270._M_allocated_capacity;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_270._M_allocated_capacity + local_270._8_8_);
      uVar9 = local_270._M_allocated_capacity;
      if (0 < (long)local_270._8_8_ >> 2) {
        uVar9 = (local_270._8_8_ & 0xfffffffffffffffc) + local_270._M_allocated_capacity;
        lVar5 = ((long)local_270._8_8_ >> 2) + 1;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_270._M_allocated_capacity + 3);
        do {
          iVar2 = isspace((int)paVar6->_M_local_buf[-3]);
          if (iVar2 == 0) {
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar6->_M_local_buf + -3);
            goto LAB_0013b942;
          }
          iVar2 = isspace((int)paVar6->_M_local_buf[-2]);
          if (iVar2 == 0) {
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar6->_M_local_buf + -2);
            goto LAB_0013b942;
          }
          iVar2 = isspace((int)paVar6->_M_local_buf[-1]);
          if (iVar2 == 0) {
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar6->_M_local_buf + -1);
            goto LAB_0013b942;
          }
          iVar2 = isspace((int)paVar6->_M_local_buf[0]);
          if (iVar2 == 0) goto LAB_0013b942;
          lVar5 = lVar5 + -1;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar6->_M_local_buf + 4);
        } while (1 < lVar5);
      }
      lVar5 = (long)paVar7 - uVar9;
      if (lVar5 == 1) {
LAB_0013b930:
        iVar2 = isspace((int)*(char *)uVar9);
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar9;
        if (iVar2 != 0) {
          paVar6 = paVar7;
        }
      }
      else if (lVar5 == 2) {
LAB_0013b7d4:
        iVar2 = isspace((int)*(char *)uVar9);
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar9;
        if (iVar2 != 0) {
          uVar9 = uVar9 + 1;
          goto LAB_0013b930;
        }
      }
      else {
        paVar6 = paVar7;
        if ((lVar5 == 3) &&
           (iVar2 = isspace((int)*(char *)uVar9),
           paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar9, iVar2 != 0)) {
          uVar9 = uVar9 + 1;
          goto LAB_0013b7d4;
        }
      }
LAB_0013b942:
      if (paVar7 == paVar6) {
        local_270._8_8_ = 0;
        *(char *)uVar8 = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)(local_280 + 0x10),0);
      }
      uVar9 = local_270._M_allocated_capacity;
      uVar8 = local_270._M_allocated_capacity + local_270._8_8_;
      lVar5 = (long)local_270._8_8_ >> 2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar8;
      if (0 < lVar5) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(uVar8 + lVar5 * -4);
        lVar5 = lVar5 + 1;
        do {
          iVar2 = isspace((int)*(char *)(uVar8 + -1));
          if (iVar2 == 0) goto LAB_0013ba4d;
          iVar2 = isspace((int)*(char *)(uVar8 + -2));
          if (iVar2 == 0) {
            uVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar8 + -1);
            goto LAB_0013ba4d;
          }
          iVar2 = isspace((int)*(char *)(uVar8 + -3));
          if (iVar2 == 0) {
            uVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar8 + -2);
            goto LAB_0013ba4d;
          }
          iVar2 = isspace((int)*(char *)(uVar8 + -4));
          if (iVar2 == 0) {
            uVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar8 + -3);
            goto LAB_0013ba4d;
          }
          uVar8 = uVar8 + -4;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      lVar5 = (long)paVar7 - uVar9;
      if (lVar5 == 1) {
LAB_0013ba21:
        iVar2 = isspace((int)paVar7->_M_local_buf[-1]);
        uVar8 = paVar7;
        if (iVar2 != 0) {
          uVar8 = uVar9;
        }
      }
      else if (lVar5 == 2) {
LAB_0013ba10:
        iVar2 = isspace((int)paVar7->_M_local_buf[-1]);
        uVar8 = paVar7;
        if (iVar2 != 0) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + -1);
          goto LAB_0013ba21;
        }
      }
      else {
        uVar8 = uVar9;
        if ((lVar5 == 3) &&
           (iVar2 = isspace((int)paVar7->_M_local_buf[-1]), uVar8 = paVar7, iVar2 != 0)) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + -1);
          goto LAB_0013ba10;
        }
      }
LAB_0013ba4d:
      local_270._8_8_ = uVar8 - uVar9;
      *(char *)uVar8 = '\0';
      local_230._M_allocated_capacity = (size_type)&local_220;
      local_230._8_8_ = 0;
      local_220._M_local_buf[0] = '\0';
      local_210._8_8_ = 0;
      local_200[0]._M_local_buf[0] = '\0';
      local_200[1]._8_8_ = 0;
      local_1e0._M_local_buf[0] = '\0';
      uStack_1a0 = 0;
      uStack_19c = 0;
      uStack_194 = 0;
      uStack_1c8 = 0;
      uStack_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      local_1ac = 0;
      uStack_1a8 = 2;
      uStack_1a4 = 0;
      local_210._0_8_ = local_200;
      local_200[1]._0_8_ = &local_1e0;
      ParsedURL::Parse((ParsedURL *)local_280,(string *)&local_230);
      if ((StateMachine *)local_280._0_8_ == (StateMachine *)0x0) {
        StateMachine::OnSSDPResponse(*(StateMachine **)data,(ParsedURL *)&local_230);
        this->State = (StateMachine *)0x0;
      }
      else {
        this->State = (StateMachine *)local_280._0_8_;
        local_280._0_8_ = (StateMachine *)0x0;
      }
      Result::~Result((Result *)local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200[1]._0_8_ != &local_1e0) {
        operator_delete((void *)local_200[1]._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_allocated_capacity != &local_220) {
        operator_delete((void *)local_230._M_allocated_capacity);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_280 + 0x20);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_allocated_capacity == paVar7) goto LAB_0013b5b4;
  }
  else {
    local_230._M_allocated_capacity = (size_type)&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"Truncated UDP response","");
    pSVar4 = (StateMachine *)operator_new(0x38);
    pSVar4->Host = (AsioHost *)0x0;
    pSVar4->SSDP = (SSDPRequester *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar4->SSDP,local_230._M_allocated_capacity,
               (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
LAB_0013b58a:
    *(undefined4 *)((long)&(pSVar4->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
    (pSVar4->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x2;
    this->State = pSVar4;
    local_270._M_allocated_capacity = local_230._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_allocated_capacity == &local_220) goto LAB_0013b5b4;
  }
  operator_delete((void *)local_270._M_allocated_capacity);
LAB_0013b5b4:
  if ((undefined1 *)local_250._M_allocated_capacity != local_240) {
    operator_delete((void *)local_250._M_allocated_capacity);
  }
  local_148[0] = _VTT;
  *(undefined8 *)((long)local_148 + *(long *)(_VTT + -0x18)) = _pthread_setaffinity_np;
  local_148[1] = 0;
  std::ios_base::~ios_base(local_138);
  local_188 = (undefined **)local_280._8_8_;
  std::locale::~locale(local_150);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::OnUDPDatagram(char* data, unsigned bytes)
{
    membuf sbuf(data, data + bytes);
    std::istream is(&sbuf);

    std::string line;

    // Check if response starts with a success code
    if (!std::getline(is, line)) {
        return Result("Truncated UDP response");
    }
    if (line.find("200 OK") == std::string::npos) {
        return Result("Ignoring malformed UDP response (No \"200 OK\")");
    }

    //ModuleLogger.Info("**** ", SourceAddress.address().to_string(), ":", SourceAddress.port());

    // For each remaining line:
    while (std::getline(is, line))
    {
        //ModuleLogger.Info("LINE: ", line);

        const bool isLocation = (0 == StrCaseCompare(line.substr(0, 9).c_str(), "location:"));
        if (!isLocation) {
            continue;
        }

        // Parse out the first HTTP or HTTPS URL in the response.
        const std::string::size_type begin = line.find("://");
        if (begin == std::string::npos) {
            return Result("Ignoring malformed UDP response (No protocol)");
        }
        std::string url(line, begin + 3);
        trim(url);

        ParsedURL parsed;
        Result result = parsed.Parse(url);
        if (result.IsFail()) {
            return result;
        }

        State->OnSSDPResponse(parsed);
        return Result::Success();
    }

    return Result("No location found");
}